

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O1

ReduceLayerParams * __thiscall
CoreML::Specification::NeuralNetworkLayer::mutable_reduce(NeuralNetworkLayer *this)

{
  ReduceLayerParams *this_00;
  
  if (this->_oneof_case_[0] != 0x118) {
    clear_layer(this);
    this->_oneof_case_[0] = 0x118;
    this_00 = (ReduceLayerParams *)operator_new(0x20);
    ReduceLayerParams::ReduceLayerParams(this_00);
    (this->layer_).reduce_ = this_00;
  }
  return (ReduceLayerParams *)(this->layer_).convolution_;
}

Assistant:

inline ::CoreML::Specification::ReduceLayerParams* NeuralNetworkLayer::mutable_reduce() {
  if (!has_reduce()) {
    clear_layer();
    set_has_reduce();
    layer_.reduce_ = new ::CoreML::Specification::ReduceLayerParams;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.NeuralNetworkLayer.reduce)
  return layer_.reduce_;
}